

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O1

void Abc_ConvertAigToBdd_rec1(DdManager *dd,Hop_Obj_t *pObj)

{
  ulong *puVar1;
  DdNode *g;
  DdNode *pDVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                  ,0x2d5,"void Abc_ConvertAigToBdd_rec1(DdManager *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 4) {
    Abc_ConvertAigToBdd_rec1(dd,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Abc_ConvertAigToBdd_rec1(dd,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    puVar1 = (ulong *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    if (puVar1 == (ulong *)0x0) {
      pDVar2 = (DdNode *)0x0;
    }
    else {
      pDVar2 = (DdNode *)((ulong)((uint)pObj->pFanin0 & 1) ^ *puVar1);
    }
    puVar1 = (ulong *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if (puVar1 == (ulong *)0x0) {
      g = (DdNode *)0x0;
    }
    else {
      g = (DdNode *)((ulong)((uint)pObj->pFanin1 & 1) ^ *puVar1);
    }
    pDVar2 = Cudd_bddAnd(dd,pDVar2,g);
    (pObj->field_0).pData = pDVar2;
    Cudd_Ref(pDVar2);
    if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                    ,0x2dc,"void Abc_ConvertAigToBdd_rec1(DdManager *, Hop_Obj_t *)");
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
  }
  return;
}

Assistant:

void Abc_ConvertAigToBdd_rec1( DdManager * dd, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertAigToBdd_rec1( dd, Hop_ObjFanin0(pObj) ); 
    Abc_ConvertAigToBdd_rec1( dd, Hop_ObjFanin1(pObj) );
    pObj->pData = Cudd_bddAnd( dd, (DdNode *)Hop_ObjChild0Copy(pObj), (DdNode *)Hop_ObjChild1Copy(pObj) ); 
    Cudd_Ref( (DdNode *)pObj->pData );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}